

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int CBB_flush_asn1_set_of(CBB *cbb)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  size_t size;
  CBS *__base;
  uint8_t *puVar4;
  size_t sVar5;
  CBS *out;
  long lVar6;
  size_t sVar7;
  ulong num;
  size_t *psVar8;
  bool bVar9;
  CBS cbs;
  
  iVar1 = CBB_flush(cbb);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    puVar3 = CBB_data(cbb);
    cbs.len = CBB_len(cbb);
    lVar6 = 1;
    cbs.data = puVar3;
    while (cbs.len != 0) {
      iVar1 = CBS_get_any_asn1_element(&cbs,(CBS *)0x0,(CBS_ASN1_TAG *)0x0,(size_t *)0x0);
      if (iVar1 == 0) {
        ERR_put_error(0xe,0,0x42,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                      ,0x297);
        return 0;
      }
      lVar6 = lVar6 + 1;
    }
    num = lVar6 - 1;
    if (num < 2) {
      iVar1 = 1;
    }
    else {
      size = CBB_len(cbb);
      puVar3 = CBB_data(cbb);
      puVar3 = (uint8_t *)OPENSSL_memdup(puVar3,size);
      __base = (CBS *)OPENSSL_calloc(num,0x10);
      iVar1 = 0;
      if (__base != (CBS *)0x0 && puVar3 != (uint8_t *)0x0) {
        out = __base;
        cbs.data = puVar3;
        cbs.len = size;
LAB_003d47cf:
        lVar6 = lVar6 + -1;
        if (lVar6 != 0) goto code_r0x003d47d4;
        qsort(__base,num,0x10,compare_set_of_element);
        puVar4 = CBB_data(cbb);
        psVar8 = &__base->len;
        sVar7 = 0;
        while (bVar9 = num != 0, num = num - 1, bVar9) {
          if (*psVar8 == 0) {
            sVar5 = 0;
          }
          else {
            memcpy(puVar4 + sVar7,((CBS *)(psVar8 + -1))->data,*psVar8);
            sVar5 = *psVar8;
          }
          sVar7 = sVar7 + sVar5;
          psVar8 = psVar8 + 2;
        }
        if (sVar7 != size) {
          __assert_fail("offset == buf_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                        ,700,"int CBB_flush_asn1_set_of(CBB *)");
        }
        iVar1 = 1;
      }
LAB_003d484f:
      OPENSSL_free(puVar3);
      OPENSSL_free(__base);
    }
  }
  return iVar1;
code_r0x003d47d4:
  iVar1 = 0;
  iVar2 = CBS_get_any_asn1_element(&cbs,out,(CBS_ASN1_TAG *)0x0,(size_t *)0x0);
  out = out + 1;
  if (iVar2 == 0) goto LAB_003d484f;
  goto LAB_003d47cf;
}

Assistant:

int CBB_flush_asn1_set_of(CBB *cbb) {
  if (!CBB_flush(cbb)) {
    return 0;
  }

  CBS cbs;
  size_t num_children = 0;
  CBS_init(&cbs, CBB_data(cbb), CBB_len(cbb));
  while (CBS_len(&cbs) != 0) {
    if (!CBS_get_any_asn1_element(&cbs, NULL, NULL, NULL)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
      return 0;
    }
    num_children++;
  }

  if (num_children < 2) {
    return 1;  // Nothing to do. This is the common case for X.509.
  }

  // Parse out the children and sort. We alias them into a copy of so they
  // remain valid as we rewrite |cbb|.
  int ret = 0;
  size_t buf_len = CBB_len(cbb);
  uint8_t *buf =
      reinterpret_cast<uint8_t *>(OPENSSL_memdup(CBB_data(cbb), buf_len));
  CBS *children =
      reinterpret_cast<CBS *>(OPENSSL_calloc(num_children, sizeof(CBS)));
  uint8_t *out;
  size_t offset = 0;
  if (buf == NULL || children == NULL) {
    goto err;
  }
  CBS_init(&cbs, buf, buf_len);
  for (size_t i = 0; i < num_children; i++) {
    if (!CBS_get_any_asn1_element(&cbs, &children[i], NULL, NULL)) {
      goto err;
    }
  }
  qsort(children, num_children, sizeof(CBS), compare_set_of_element);

  // Write the contents back in the new order.
  out = (uint8_t *)CBB_data(cbb);
  for (size_t i = 0; i < num_children; i++) {
    OPENSSL_memcpy(out + offset, CBS_data(&children[i]), CBS_len(&children[i]));
    offset += CBS_len(&children[i]);
  }
  assert(offset == buf_len);

  ret = 1;

err:
  OPENSSL_free(buf);
  OPENSSL_free(children);
  return ret;
}